

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O2

bool __thiscall
dxil_spv::DXILContainerParser::parse_container
          (DXILContainerParser *this,void *data,size_t size,bool reflection)

{
  bool bVar1;
  size_t sVar2;
  Vector<DXIL::IOElement> *elements;
  ulong uVar3;
  FourCC expected;
  uint32_t uVar4;
  DXILContainerParser *pDVar5;
  long lVar6;
  iterator __begin1;
  uint *buffer;
  pointer puVar7;
  bool bVar8;
  PartHeader part_header;
  Vector<uint32_t> parts;
  ContainerHeader container_header;
  MemoryStream stream;
  MemoryStream substream;
  
  MemoryStream::MemoryStream(&stream,data,size);
  bVar1 = MemoryStream::read<DXIL::ContainerHeader>(&stream,&container_header);
  bVar8 = false;
  if (((bVar1) && (container_header.header_fourcc == 0x43425844)) &&
     (container_header.container_size_in_bytes <= size)) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&parts,(ulong)container_header.part_count,(allocator_type *)&substream);
    uVar3 = 0xffffffffffffffff;
    lVar6 = 0;
    do {
      uVar3 = uVar3 + 1;
      if (container_header.part_count <= uVar3) {
        uVar4 = 0x4c495844;
        if (reflection) {
          uVar4 = 0x54415453;
        }
        puVar7 = parts.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        goto LAB_00141a90;
      }
      buffer = (uint *)((long)parts.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6);
      lVar6 = lVar6 + 4;
      bVar1 = MemoryStream::read<unsigned_int>(&stream,buffer);
    } while (bVar1);
LAB_00141a38:
    bVar8 = false;
LAB_00141a3b:
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&parts.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  }
  return bVar8;
LAB_00141a90:
  bVar8 = puVar7 == parts.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  if (bVar8) goto LAB_00141a3b;
  bVar1 = MemoryStream::seek(&stream,(ulong)*puVar7);
  if (!bVar1) goto LAB_00141a3b;
  bVar1 = MemoryStream::read<DXIL::PartHeader>(&stream,&part_header);
  if (!bVar1) goto LAB_00141a38;
  pDVar5 = (DXILContainerParser *)&substream;
  if (part_header.part_fourcc == 0x31475349) {
    sVar2 = MemoryStream::get_offset(&stream);
    MemoryStream::create_substream(&substream,&stream,sVar2,(ulong)part_header.part_size);
    elements = &this->input_elements;
LAB_00141b85:
    bVar1 = parse_iosg1(pDVar5,&substream,elements);
LAB_00141b8a:
    if (bVar1 == false) goto LAB_00141a38;
  }
  else {
    if (part_header.part_fourcc == 0x3147534f) {
      sVar2 = MemoryStream::get_offset(&stream);
      MemoryStream::create_substream(&substream,&stream,sVar2,(ulong)part_header.part_size);
      elements = &this->output_elements;
      goto LAB_00141b85;
    }
    if (part_header.part_fourcc == 0x54415453) {
LAB_00141ae5:
      if (uVar4 != part_header.part_fourcc) goto LAB_00141b92;
      sVar2 = MemoryStream::get_offset(&stream);
      MemoryStream::create_substream(&substream,&stream,sVar2,(ulong)part_header.part_size);
      bVar1 = parse_dxil(this,&substream);
      goto LAB_00141b8a;
    }
    if (part_header.part_fourcc == 0x54414452) {
      sVar2 = MemoryStream::get_offset(&stream);
      MemoryStream::create_substream(&substream,&stream,sVar2,(ulong)part_header.part_size);
      bVar1 = parse_rdat(this,&substream);
      goto LAB_00141b8a;
    }
    if (part_header.part_fourcc == 0x4c495844) goto LAB_00141ae5;
  }
LAB_00141b92:
  puVar7 = puVar7 + 1;
  goto LAB_00141a90;
}

Assistant:

bool DXILContainerParser::parse_container(const void *data, size_t size, bool reflection)
{
	MemoryStream stream(data, size);

	DXIL::ContainerHeader container_header;
	if (!stream.read(container_header))
		return false;

	if (static_cast<DXIL::FourCC>(container_header.header_fourcc) != DXIL::FourCC::Container)
		return false;
	if (container_header.container_size_in_bytes > size)
		return false;

	Vector<uint32_t> parts(container_header.part_count);
	for (uint32_t i = 0; i < container_header.part_count; i++)
	{
		if (!stream.read(parts[i]))
			return false;
	}

	for (auto &part_offset : parts)
	{
		if (!stream.seek(part_offset))
			return false;

		DXIL::PartHeader part_header;
		if (!stream.read(part_header))
			return false;

		auto fourcc = static_cast<DXIL::FourCC>(part_header.part_fourcc);
		switch (fourcc)
		{
		case DXIL::FourCC::DXIL:
		case DXIL::FourCC::ShaderStatistics:
		{
			DXIL::FourCC expected = reflection ? DXIL::FourCC::ShaderStatistics : DXIL::FourCC::DXIL;
			if (expected != fourcc)
				break;

			// The STAT block includes a DXIL blob that is literally the same DXIL IR
			// minus code + string names in the metadata chunks ... <__________________________________<
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_dxil(substream))
				return false;
			break;
		}

		case DXIL::FourCC::FeatureInfo:
			break;

		case DXIL::FourCC::InputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, input_elements))
				return false;
			break;
		}

		case DXIL::FourCC::OutputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, output_elements))
				return false;
			break;
		}

		case DXIL::FourCC::PatchConstantSignature:
			break;

		case DXIL::FourCC::PrivateData:
			break;

		case DXIL::FourCC::RootSignature:
			break;

		case DXIL::FourCC::PipelineStateValidation:
			break;

		case DXIL::FourCC::ResourceDef:
			break;

		case DXIL::FourCC::ShaderHash:
			break;

		case DXIL::FourCC::RuntimeData:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_rdat(substream))
				return false;
			break;
		}

		default:
			break;
		}
	}

	return true;
}